

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O3

void __thiscall
Assimp::HMPImporter::InternReadFile
          (HMPImporter *this,string *pFile,aiScene *_pScene,IOSystem *_pIOHandler)

{
  aiScene *paVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  uchar *puVar4;
  runtime_error *prVar5;
  Logger *pLVar6;
  long *extraout_RAX;
  long *plVar7;
  size_type *psVar8;
  long *extraout_RDX;
  char szBuffer [5];
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  (this->super_MDLImporter).pScene = _pScene;
  (this->super_MDLImporter).pIOHandler = _pIOHandler;
  local_b0 = &local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"rb","");
  iVar2 = (*_pIOHandler->_vptr_IOSystem[4])(_pIOHandler,(pFile->_M_dataplus)._M_p,local_b0);
  prVar5 = (runtime_error *)CONCAT44(extraout_var,iVar2);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (prVar5 == (runtime_error *)0x0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_90,"Failed to open HMP file ",pFile);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_b0 = (long *)*plVar3;
    plVar7 = plVar3 + 2;
    if (local_b0 == plVar7) {
      local_a0 = *plVar7;
      lStack_98 = plVar3[3];
      local_b0 = &local_a0;
      goto LAB_0042d82d;
    }
  }
  else {
    plVar3 = (long *)(**(code **)(*(long *)prVar5 + 0x30))(prVar5);
    if (plVar3 < (long *)0x32) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_b0 = &local_a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"HMP File is too small.","");
      std::runtime_error::runtime_error(prVar5,(string *)&local_b0);
      *(undefined ***)prVar5 = &PTR__runtime_error_007da4b8;
      __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    puVar4 = (uchar *)operator_new__((ulong)plVar3);
    (this->super_MDLImporter).mBuffer = puVar4;
    plVar7 = plVar3;
    (**(code **)(*(long *)prVar5 + 0x10))(prVar5,puVar4,1);
    (this->super_MDLImporter).iFileSize = (uint)plVar3;
    iVar2 = *(int *)(this->super_MDLImporter).mBuffer;
    if (iVar2 < 0x484d5034) {
      if (iVar2 == 0x35504d48) {
LAB_0042d6e9:
        pLVar6 = DefaultLogger::get();
        Logger::debug(pLVar6,"HMP subtype: 3D GameStudio A5, magic word is HMP5");
        InternReadFile_HMP5(this);
LAB_0042d705:
        paVar1 = (this->super_MDLImporter).pScene;
        paVar1->mFlags = paVar1->mFlags | 0x10;
        puVar4 = (this->super_MDLImporter).mBuffer;
        if (puVar4 != (uchar *)0x0) {
          operator_delete__(puVar4);
        }
        (this->super_MDLImporter).mBuffer = (uchar *)0x0;
        (**(code **)(*(long *)prVar5 + 8))(prVar5);
        return;
      }
      if (iVar2 == 0x37504d48) {
LAB_0042d6cb:
        pLVar6 = DefaultLogger::get();
        Logger::debug(pLVar6,"HMP subtype: 3D GameStudio A7, magic word is HMP7");
        InternReadFile_HMP7(this);
        goto LAB_0042d705;
      }
      if (iVar2 != 0x34504d48) {
LAB_0042d63e:
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_70,"Unknown HMP subformat ",pFile);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_50 = (long *)*plVar3;
        plVar7 = plVar3 + 2;
        if (local_50 == plVar7) {
          local_40 = *plVar7;
          lStack_38 = plVar3[3];
          local_50 = &local_40;
        }
        else {
          local_40 = *plVar7;
        }
        local_48 = plVar3[1];
        *plVar3 = (long)plVar7;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_90._M_dataplus._M_p = (pointer)*plVar3;
        psVar8 = (size_type *)(plVar3 + 2);
        if ((size_type *)local_90._M_dataplus._M_p == psVar8) {
          local_90.field_2._M_allocated_capacity = *psVar8;
          local_90.field_2._8_8_ = plVar3[3];
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar8;
        }
        local_90._M_string_length = plVar3[1];
        *plVar3 = (long)psVar8;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_b0 = (long *)*plVar3;
        plVar7 = plVar3 + 2;
        if (local_b0 == plVar7) {
          local_a0 = *plVar7;
          lStack_98 = plVar3[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar7;
        }
        local_a8 = plVar3[1];
        *plVar3 = (long)plVar7;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::runtime_error::runtime_error(prVar5,(string *)&local_b0);
        *(undefined ***)prVar5 = &PTR__runtime_error_007da4b8;
        __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      if (iVar2 == 0x484d5035) goto LAB_0042d6e9;
      if (iVar2 == 0x484d5037) goto LAB_0042d6cb;
      if (iVar2 != 0x484d5034) goto LAB_0042d63e;
    }
    pLVar6 = DefaultLogger::get();
    Logger::debug(pLVar6,"HMP subtype: 3D GameStudio A4, magic word is HMP4");
    InternReadFile_HMP4((HMPImporter *)pLVar6);
    plVar3 = extraout_RAX;
    local_b0 = extraout_RDX;
  }
  local_a0 = *plVar7;
LAB_0042d82d:
  local_a8 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(prVar5,(string *)&local_b0);
  *(undefined ***)prVar5 = &PTR__runtime_error_007da4b8;
  __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void HMPImporter::InternReadFile( const std::string& pFile,
                                 aiScene* _pScene, IOSystem* _pIOHandler)
{
    pScene     = _pScene;
    pIOHandler = _pIOHandler;
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open HMP file " + pFile + ".");

    // Check whether the HMP file is large enough to contain
    // at least the file header
    const size_t fileSize = file->FileSize();
    if( fileSize < 50)
        throw DeadlyImportError( "HMP File is too small.");

    // Allocate storage and copy the contents of the file to a memory buffer
    mBuffer = new uint8_t[fileSize];
    file->Read( (void*)mBuffer, 1, fileSize);
    iFileSize = (unsigned int)fileSize;

    // Determine the file subtype and call the appropriate member function
    const uint32_t iMagic = *((uint32_t*)this->mBuffer);

    // HMP4 format
    if (AI_HMP_MAGIC_NUMBER_LE_4 == iMagic ||
        AI_HMP_MAGIC_NUMBER_BE_4 == iMagic)
    {
        ASSIMP_LOG_DEBUG("HMP subtype: 3D GameStudio A4, magic word is HMP4");
        InternReadFile_HMP4();
    }
    // HMP5 format
    else if (AI_HMP_MAGIC_NUMBER_LE_5 == iMagic ||
             AI_HMP_MAGIC_NUMBER_BE_5 == iMagic)
    {
        ASSIMP_LOG_DEBUG("HMP subtype: 3D GameStudio A5, magic word is HMP5");
        InternReadFile_HMP5();
    }
    // HMP7 format
    else if (AI_HMP_MAGIC_NUMBER_LE_7 == iMagic ||
             AI_HMP_MAGIC_NUMBER_BE_7 == iMagic)
    {
        ASSIMP_LOG_DEBUG("HMP subtype: 3D GameStudio A7, magic word is HMP7");
        InternReadFile_HMP7();
    }
    else
    {
        // Print the magic word to the logger
        char szBuffer[5];
        szBuffer[0] = ((char*)&iMagic)[0];
        szBuffer[1] = ((char*)&iMagic)[1];
        szBuffer[2] = ((char*)&iMagic)[2];
        szBuffer[3] = ((char*)&iMagic)[3];
        szBuffer[4] = '\0';

        // We're definitely unable to load this file
        throw DeadlyImportError( "Unknown HMP subformat " + pFile +
            ". Magic word (" + szBuffer + ") is not known");
    }

    // Set the AI_SCENE_FLAGS_TERRAIN bit
    pScene->mFlags |= AI_SCENE_FLAGS_TERRAIN;

    delete[] mBuffer;
    mBuffer= nullptr;

}